

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

_Bool modify_monster_trap(loc grid)

{
  _Bool _Var1;
  short sVar2;
  short sVar3;
  void *p;
  long lVar4;
  bool bVar5;
  char *fmt;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ui_event uVar9;
  region local_118;
  menu_iter menu_f;
  menu menu;
  
  if ((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) {
    fmt = "You can not see to modify your trap.";
  }
  else {
    if ((player->timed[4] == 0) && (player->timed[6] == 0)) {
      _Var1 = player_is_shapechanged(player);
      if (_Var1) {
        msg("You cannot do this while in %s form.",player->shape->name);
        _Var1 = get_check("Do you want to change back? ");
        if (!_Var1) {
          return false;
        }
        player_resume_normal_shape(player);
      }
      menu_f.resize = (_func_void_menu_ptr_conflict *)0x0;
      menu_f.display_row = mtrap_display;
      menu_f.row_handler = mtrap_action;
      menu_f.get_tag = mtrap_tag;
      menu_f.valid_row = (_func_int_menu_ptr_int *)0x0;
      local_118.col = L'\x0f';
      local_118.row = L'\x01';
      local_118.width = L'0';
      mtrap_grid = grid;
      _Var1 = flag_has_dbg((player->state).pflags,10,0x4d,"player->state.pflags","(PF_EXTRA_TRAP)");
      sVar2 = player->lev / (short)((ushort)!_Var1 * 2 + 4);
      sVar3 = sVar2 + 1;
      p = mem_zalloc((long)sVar3 * 0x88);
      lVar4 = 0x68;
      lVar7 = 0;
      bVar5 = false;
      for (uVar8 = 0; uVar8 < z_info->trap_max; uVar8 = uVar8 + 1) {
        _Var1 = flag_has_dbg(trap_info->flags + lVar4 + -0x68,3,0x10,"trap_info[i].flags",
                             "TRF_M_TRAP");
        if (_Var1) {
          if (bVar5) {
            lVar6 = lVar7 * 0x88;
            lVar7 = lVar7 + 1;
            memcpy((void *)(lVar6 + (long)p),(void *)((long)trap_info + lVar4 + -0x68),0x88);
            goto LAB_001c5b1a;
          }
          bVar5 = true;
        }
        else {
LAB_001c5b1a:
          if (lVar7 == sVar3) break;
        }
        lVar4 = lVar4 + 0x88;
      }
      local_118.page_rows = (wchar_t)(short)(sVar2 + 3);
      if (sVar3 == 0) {
        mem_free(p);
        return true;
      }
      screen_save();
      menu_init((menu_conflict *)&menu,MN_SKIN_SCROLL,&menu_f);
      menu.title = "Choose an advanced monster trap (ESC to cancel):";
      menu_setpriv((menu_conflict *)&menu,(int)sVar3,p);
      menu.browse_hook = mtrap_menu_browser;
      menu.flags = L'\x10';
      region_erase_bordered(&local_118);
      menu_layout((menu_conflict *)&menu,(region_conflict *)&local_118);
      prt("",local_118.row + L'\x01',local_118.col);
      uVar9 = menu_select((menu_conflict *)&menu,0,true);
      mem_free(p);
      screen_load();
      _Var1 = true;
      if (uVar9.type == EVT_ESCAPE) {
        return true;
      }
      fmt = "You modify the monster trap.";
      goto LAB_001c598d;
    }
    fmt = "You are too confused.";
  }
  _Var1 = false;
LAB_001c598d:
  msg(fmt);
  return _Var1;
}

Assistant:

bool modify_monster_trap(struct loc grid)
{
	if (player->timed[TMD_BLIND] || no_light(player)) {
		msg("You can not see to modify your trap.");
		return false;
	}

	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) {
		msg("You are too confused.");
		return false;
	}

	/* No setting traps while shapeshifted */
	if (player_is_shapechanged(player)) {
		msg("You cannot do this while in %s form.",	player->shape->name);
		if (get_check("Do you want to change back? " )) {
			player_resume_normal_shape(player);
		} else {
			return false;
		}
	}

	mtrap_grid = grid;

	/* Get choice */
	if (mtrap_menu()) {
		/* Notify the player. */
		msg("You modify the monster trap.");
	}

	/* Trap was modified */
	return true;
}